

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_LevelInit(void)

{
  double dVar1;
  char *pcVar2;
  vertex_t *pvVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  char *name;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pcVar2 = ((level.info)->MapBackground).Chars;
  name = "AUTOPAGE";
  if (*(int *)(pcVar2 + -0xc) != 0) {
    name = pcVar2;
  }
  mapback = FTextureManager::CheckForTexture(&TexMan,name,8,1);
  AM_clearMarks();
  pvVar3 = vertexes;
  min_y = 3.4028234663852886e+38;
  min_x = 3.4028234663852886e+38;
  max_y = -2147483648.0;
  max_x = -2147483648.0;
  uVar6 = 0;
  uVar5 = (ulong)(uint)numvertexes;
  if (numvertexes < 1) {
    uVar5 = uVar6;
  }
  dVar8 = 3.4028234663852886e+38;
  dVar9 = -2147483648.0;
  dVar11 = -2147483648.0;
  dVar10 = 3.4028234663852886e+38;
  do {
    if (uVar5 * 0x10 == uVar6) {
      max_w = dVar11 - dVar10;
      max_h = dVar9 - dVar8;
      AM_calcMinMaxMtoF();
      scale_mtof = min_scale_mtof / 0.7;
      if (max_scale_mtof < min_scale_mtof / 0.7) {
        scale_mtof = min_scale_mtof;
      }
      scale_ftom = 1.0 / scale_mtof;
      if (am_showalllines.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
        (*am_showalllines.super_FBaseCVar.m_Callback)(&am_showalllines.super_FBaseCVar);
        return;
      }
      return;
    }
    dVar1 = *(double *)((long)&(pvVar3->p).X + uVar6);
    if (dVar10 <= dVar1) {
      pdVar7 = &max_x;
      dVar4 = dVar1;
      if (dVar11 < dVar1) goto LAB_00363e91;
    }
    else {
      pdVar7 = &min_x;
      dVar10 = dVar1;
      dVar4 = dVar11;
LAB_00363e91:
      dVar11 = dVar4;
      *pdVar7 = dVar1;
    }
    dVar1 = *(double *)((long)&(pvVar3->p).Y + uVar6);
    if (dVar8 <= dVar1) {
      pdVar7 = &max_y;
      dVar4 = dVar1;
      if (dVar9 < dVar1) goto LAB_00363ec0;
    }
    else {
      pdVar7 = &min_y;
      dVar8 = dVar1;
      dVar4 = dVar9;
LAB_00363ec0:
      dVar9 = dVar4;
      *pdVar7 = dVar1;
    }
    uVar6 = uVar6 + 0x10;
  } while( true );
}

Assistant:

void AM_LevelInit ()
{
	if (level.info->MapBackground.Len() == 0)
	{
		mapback = TexMan.CheckForTexture("AUTOPAGE", FTexture::TEX_MiscPatch);
	}
	else
	{
		mapback = TexMan.CheckForTexture(level.info->MapBackground, FTexture::TEX_MiscPatch);
	}

	AM_clearMarks();

	AM_findMinMaxBoundaries();
	scale_mtof = min_scale_mtof / 0.7;
	if (scale_mtof > max_scale_mtof)
		scale_mtof = min_scale_mtof;
	scale_ftom = 1 / scale_mtof;

	am_showalllines.Callback();
}